

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O0

DdNode * Dec_GraphDeriveBdd(DdManager *dd,Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  void *pvVar2;
  int iVar3;
  DdNode *pDVar4;
  Dec_Node_t *pDVar5;
  int local_44;
  Dec_Node_t *pDStack_40;
  int i;
  Dec_Node_t *pNode;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFunc;
  Dec_Graph_t *pGraph_local;
  DdManager *dd_local;
  
  pDStack_40 = (Dec_Node_t *)0x0;
  iVar3 = Dec_GraphLeaveNum(pGraph);
  if (iVar3 < 0) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                  ,0x39,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
  }
  iVar3 = Dec_GraphLeaveNum(pGraph);
  if (pGraph->nSize < iVar3) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) <= pGraph->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                  ,0x3a,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
  }
  iVar3 = Dec_GraphIsConst(pGraph);
  if (iVar3 == 0) {
    iVar3 = Dec_GraphIsVar(pGraph);
    if (iVar3 == 0) {
      for (local_44 = 0; local_44 < pGraph->nLeaves; local_44 = local_44 + 1) {
        pDStack_40 = Dec_GraphNode(pGraph,local_44);
        pDVar4 = Cudd_bddIthVar(dd,local_44);
        (pDStack_40->field_2).pFunc = pDVar4;
      }
      for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
        pDStack_40 = Dec_GraphNode(pGraph,local_44);
        pDVar5 = Dec_GraphNode(pGraph,(uint)pDStack_40->eEdge0 >> 1 & 0x3fffffff);
        pvVar2 = (pDVar5->field_2).pFunc;
        DVar1 = pDStack_40->eEdge0;
        pDVar5 = Dec_GraphNode(pGraph,(uint)pDStack_40->eEdge1 >> 1 & 0x3fffffff);
        pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar2 ^ (ulong)((uint)DVar1 & 1)),
                             (DdNode *)
                             ((ulong)(pDVar5->field_2).pFunc ^ (ulong)((uint)pDStack_40->eEdge1 & 1)
                             ));
        (pDStack_40->field_2).pFunc = pDVar4;
        Cudd_Ref((DdNode *)(pDStack_40->field_2).pFunc);
      }
      pDVar4 = (DdNode *)(pDStack_40->field_2).pFunc;
      Cudd_Ref(pDVar4);
      for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
        pDVar5 = Dec_GraphNode(pGraph,local_44);
        Cudd_RecursiveDeref(dd,(DdNode *)(pDVar5->field_2).pFunc);
      }
      Cudd_Deref(pDVar4);
      iVar3 = Dec_GraphIsComplement(pGraph);
      dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
    }
    else {
      iVar3 = Dec_GraphVarInt(pGraph);
      pDVar4 = Cudd_bddIthVar(dd,iVar3);
      iVar3 = Dec_GraphIsComplement(pGraph);
      dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
    }
  }
  else {
    pDVar4 = dd->one;
    iVar3 = Dec_GraphIsComplement(pGraph);
    dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Dec_GraphDeriveBdd( DdManager * dd, Dec_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Dec_GraphVarInt(pGraph)), Dec_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Dec_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Dec_GraphIsComplement(pGraph) );
}